

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_debugprint.c
# Opt level: O0

void PaUtil_DebugPrint(char *format,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_908 [8];
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined4 local_858;
  undefined4 local_854;
  va_list ap_1;
  undefined4 local_838;
  undefined4 local_834;
  va_list ap;
  char local_818 [8];
  char strdump [2048];
  char *format_local;
  
  if (in_AL != '\0') {
    local_8d8 = in_XMM0_Qa;
    local_8c8 = in_XMM1_Qa;
    local_8b8 = in_XMM2_Qa;
    local_8a8 = in_XMM3_Qa;
    local_898 = in_XMM4_Qa;
    local_888 = in_XMM5_Qa;
    local_878 = in_XMM6_Qa;
    local_868 = in_XMM7_Qa;
  }
  local_900 = in_RSI;
  local_8f8 = in_RDX;
  local_8f0 = in_RCX;
  local_8e8 = in_R8;
  local_8e0 = in_R9;
  if (userCB == (PaUtilLogCallback)0x0) {
    ap_1[0].overflow_arg_area = local_908;
    ap_1[0]._0_8_ = &stack0x00000008;
    local_854 = 0x30;
    local_858 = 8;
    vfprintf(_stderr,format,&local_858);
    fflush(_stderr);
  }
  else {
    ap[0].overflow_arg_area = local_908;
    ap[0]._0_8_ = &stack0x00000008;
    local_834 = 0x30;
    local_838 = 8;
    vsnprintf(local_818,0x800,format,&local_838);
    strdump[0x7f7] = '\0';
    (*userCB)(local_818);
  }
  return;
}

Assistant:

void PaUtil_DebugPrint( const char *format, ... )
{
    // Optional logging into Output console of Visual Studio
#if defined(_MSC_VER) && defined(PA_ENABLE_MSVC_DEBUG_OUTPUT)
    {
        char buf[PA_LOG_BUF_SIZE];
        va_list ap;
        va_start(ap, format);
        VSNPRINTF(buf, sizeof(buf), format, ap);
        buf[sizeof(buf)-1] = 0;
        OutputDebugStringA(buf);
        va_end(ap);
    }
#endif

    // Output to User-Callback
    if (userCB != NULL)
    {
        char strdump[PA_LOG_BUF_SIZE];
        va_list ap;
        va_start(ap, format);
        VSNPRINTF(strdump, sizeof(strdump), format, ap);
        strdump[sizeof(strdump)-1] = 0;
        userCB(strdump);
        va_end(ap);
    }
    else
    // Standard output to stderr
    {
        va_list ap;
        va_start(ap, format);
        vfprintf(stderr, format, ap);
        va_end(ap);
        fflush(stderr);
    }
}